

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O3

DdNode * Llb_NonlinImage(Aig_Man_t *pAig,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vRoots,int *pVars2Q,
                        DdManager *dd,DdNode *bCurrent,int fReorder,int fVerbose,int *pOrder)

{
  Llb_Prt_t **ppLVar1;
  Llb_Prt_t *pPart;
  int iVar2;
  int iVar3;
  Llb_Mgr_t *p;
  long lVar4;
  DdNode *n;
  long lVar5;
  DdNode *f;
  long lVar6;
  long lVar7;
  Llb_Prt_t *pPart2;
  Llb_Prt_t *pPart1;
  timespec local_60;
  DdManager *local_50;
  long local_48;
  Llb_Prt_t *local_40;
  Llb_Prt_t *local_38;
  
  local_50 = dd;
  iVar2 = clock_gettime(3,&local_60);
  if (iVar2 < 0) {
    local_48 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
    local_48 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_60.tv_sec * -1000000;
  }
  iVar2 = clock_gettime(3,&local_60);
  if (iVar2 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
  }
  p = Llb_NonlinAlloc(pAig,vLeaves,vRoots,pVars2Q,local_50);
  iVar2 = Llb_NonlinStart(p);
  if (iVar2 == 0) {
LAB_007dfda1:
    Llb_NonlinFree(p);
    n = (DdNode *)0x0;
  }
  else {
    iVar2 = p->iPartFree;
    p->iPartFree = iVar2 + 1;
    Llb_NonlinAddPartition(p,iVar2,bCurrent);
    iVar2 = p->iPartFree;
    if (0 < (long)iVar2) {
      ppLVar1 = p->pParts;
      lVar7 = 0;
      do {
        pPart = ppLVar1[lVar7];
        if (pPart != (Llb_Prt_t *)0x0) {
          lVar4 = (long)pPart->vVars->nSize;
          if (0 < lVar4) {
            lVar6 = 0;
            do {
              if (p->pVars[pPart->vVars->pArray[lVar6]]->vParts->nSize == 1) {
                Llb_NonlinQuantify1(p,pPart,0);
                break;
              }
              lVar6 = lVar6 + 1;
            } while (lVar4 != lVar6);
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != iVar2);
    }
    iVar2 = clock_gettime(3,&local_60);
    lVar4 = -1;
    lVar7 = -1;
    if (-1 < iVar2) {
      lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    timeBuild = timeBuild + (lVar7 - lVar5);
    iVar2 = clock_gettime(3,&local_60);
    if (-1 < iVar2) {
      lVar4 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    Llb_NonlinRecomputeScores(p);
    if (pOrder != (int *)0x0) {
      memcpy(pOrder,local_50->invperm,(long)local_50->size << 2);
    }
    lVar4 = lVar4 - lVar5;
    iVar3 = (int)lVar4;
    iVar2 = Llb_NonlinNextPartitions(p,&local_38,&local_40);
    if (iVar2 != 0) {
      do {
        iVar2 = clock_gettime(3,&local_60);
        if (iVar2 < 0) {
          lVar5 = 1;
        }
        else {
          lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_60.tv_nsec),8);
          lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_60.tv_sec * -1000000;
        }
        iVar2 = Cudd_ReadReorderings(local_50);
        iVar3 = Llb_NonlinQuantify2(p,local_38,local_40);
        if (iVar3 == 0) goto LAB_007dfda1;
        iVar3 = clock_gettime(3,&local_60);
        lVar6 = -1;
        lVar7 = -1;
        if (-1 < iVar3) {
          lVar7 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
        }
        timeAndEx = timeAndEx + lVar7 + lVar5;
        iVar3 = clock_gettime(3,&local_60);
        if (-1 < iVar3) {
          lVar6 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
        }
        iVar3 = Cudd_ReadReorderings(local_50);
        if (iVar2 < iVar3) {
          Llb_NonlinRecomputeScores(p);
        }
        lVar4 = lVar5 + (int)lVar4 + lVar6;
        iVar3 = (int)lVar4;
        iVar2 = Llb_NonlinNextPartitions(p,&local_38,&local_40);
      } while (iVar2 != 0);
    }
    n = Cudd_ReadOne(p->dd);
    Cudd_Ref(n);
    iVar2 = p->iPartFree;
    if (0 < iVar2) {
      lVar5 = 0;
      f = n;
      do {
        n = f;
        if (p->pParts[lVar5] != (Llb_Prt_t *)0x0) {
          n = Cudd_bddAnd(p->dd,f,p->pParts[lVar5]->bFunc);
          Cudd_Ref(n);
          Cudd_RecursiveDeref(p->dd,f);
          iVar2 = p->iPartFree;
        }
        lVar5 = lVar5 + 1;
        f = n;
      } while (lVar5 < iVar2);
    }
    nSuppMax = p->nSuppMax;
    Llb_NonlinFree(p);
    if (fReorder != 0) {
      Llb_NonlinReorder(local_50,0,fVerbose);
    }
    iVar2 = clock_gettime(3,&local_60);
    if (iVar2 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_60.tv_nsec / 1000 + local_60.tv_sec * 1000000;
    }
    timeOther = timeOther + (local_48 - iVar3) + lVar5;
    Cudd_Deref(n);
  }
  return n;
}

Assistant:

DdNode * Llb_NonlinImage( Aig_Man_t * pAig, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vRoots, int * pVars2Q, 
    DdManager * dd, DdNode * bCurrent, int fReorder, int fVerbose, int * pOrder )
{
    Llb_Prt_t * pPart, * pPart1, * pPart2;
    Llb_Mgr_t * p;
    DdNode * bFunc, * bTemp;
    int i, nReorders, timeInside;
    abctime clk = Abc_Clock(), clk2;
    // start the manager
    clk2 = Abc_Clock();
    p = Llb_NonlinAlloc( pAig, vLeaves, vRoots, pVars2Q, dd );
    if ( !Llb_NonlinStart( p ) )
    {
        Llb_NonlinFree( p );
        return NULL;
    }
    // add partition
    Llb_NonlinAddPartition( p, p->iPartFree++, bCurrent );
    // remove singles
    Llb_MgrForEachPart( p, pPart, i )
        if ( Llb_NonlinHasSingletonVars(p, pPart) )
            Llb_NonlinQuantify1( p, pPart, 0 );
    timeBuild += Abc_Clock() - clk2;
    timeInside = Abc_Clock() - clk2;
    // compute scores
    Llb_NonlinRecomputeScores( p );
    // save permutation
    if ( pOrder )
    memcpy( pOrder, dd->invperm, sizeof(int) * dd->size );
    // iteratively quantify variables
    while ( Llb_NonlinNextPartitions(p, &pPart1, &pPart2) )
    {
        clk2 = Abc_Clock();
        nReorders = Cudd_ReadReorderings(dd);
        if ( !Llb_NonlinQuantify2( p, pPart1, pPart2 ) )
        {
            Llb_NonlinFree( p );
            return NULL;
        }
        timeAndEx  += Abc_Clock() - clk2;
        timeInside += Abc_Clock() - clk2;
        if ( nReorders < Cudd_ReadReorderings(dd) )
            Llb_NonlinRecomputeScores( p );
//        else
//            Llb_NonlinVerifyScores( p );
    }
    // load partitions
    bFunc = Cudd_ReadOne(p->dd);   Cudd_Ref( bFunc );
    Llb_MgrForEachPart( p, pPart, i )
    {
        bFunc = Cudd_bddAnd( p->dd, bTemp = bFunc, pPart->bFunc );   Cudd_Ref( bFunc );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    nSuppMax = p->nSuppMax;
    Llb_NonlinFree( p );
    // reorder variables
    if ( fReorder )
        Llb_NonlinReorder( dd, 0, fVerbose );
    timeOther += Abc_Clock() - clk - timeInside;
    // return
    Cudd_Deref( bFunc );
    return bFunc;
}